

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  ushort uVar1;
  ulong uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fff) == 0x7c00) {
    return (Float<unsigned_long,_11,_52,_1023,_3U>)
           (((ulong)(-1 < (short)uVar1) << 0x3f) + 0xfff0000000000000);
  }
  uVar3 = uVar1 & 0x7c00;
  uVar4 = uVar1 & 0x3ff;
  if (uVar3 == 0x7c00 && uVar4 != 0) {
    return (Float<unsigned_long,_11,_52,_1023,_3U>)0x7fffffffffffffff;
  }
  if ((uVar1 & 0x7fff) != 0) {
    uVar5 = uVar4;
    if (uVar3 != 0 || uVar4 == 0) {
      uVar5 = uVar4 + 0x400;
    }
    uVar6 = (uint)uVar5;
    if (uVar3 != 0 || uVar4 == 0) {
      lVar7 = (ulong)(uVar1 >> 10 & 0x1f) + 0xfffffff1;
    }
    else {
      uVar2 = 0x3f;
      if ((uVar5 & 0x3ff) != 0) {
        for (; (uVar5 & 0x3ff) >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar6 = (uint)uVar5 << (~(byte)uVar2 + 0xb & 0x3f);
      lVar7 = (uVar2 ^ 0xffffffffffffffc0) + 0x28;
    }
    return (Float<unsigned_long,_11,_52,_1023,_3U>)
           ((lVar7 << 0x34) + 0x3ff0000000000000U | (ulong)(uVar1 & 0x8000) << 0x30 |
           (ulong)(uVar6 & 0x1ffbff) << 0x2a);
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)((ulong)uVar1 << 0x30);
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}